

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_char,_2U> * __thiscall
ImageT<unsigned_char,_2U>::normalize(ImageT<unsigned_char,_2U> *this)

{
  Color *pCVar1;
  uint uVar2;
  ulong uVar3;
  vec3<unsigned_char> local_38;
  
  uVar2 = (this->super_Image).height * (this->super_Image).width;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pCVar1 = this->pixels;
      local_38.super_vec3_base.r =
           (float)((ushort)*(anon_union_2_2_6556a7fb_for_color<unsigned_char,_2U>_3 *)
                            &pCVar1[uVar3].field_0.field_1 & 0xff);
      local_38.super_vec3_base.g =
           (float)(*(anon_union_2_2_6556a7fb_for_color<unsigned_char,_2U>_3 *)
                    &pCVar1[uVar3].field_0.field_1).g;
      local_38.super_vec3_base.b = 127.5;
      vec3<unsigned_char>::normalize(&local_38);
      pCVar1[uVar3].field_0.comps[0] = (uchar)(int)local_38.super_vec3_base.r;
      pCVar1[uVar3].field_0.comps[1] = (uchar)(int)local_38.super_vec3_base.g;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }